

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QString * __thiscall
QLocale::toCurrencyString
          (QString *__return_storage_ptr__,QLocale *this,qulonglong value,QString *symbol)

{
  char16_t *pcVar1;
  long lVar2;
  QLocaleData *pQVar3;
  QArrayData *pQVar4;
  undefined1 *puVar5;
  Data *pDVar6;
  undefined1 *puVar7;
  QArrayData *pQVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 data;
  undefined8 uVar11;
  QLocalePrivate *pQVar12;
  QSystemLocale *pQVar13;
  ulong size;
  long in_FS_OFFSET;
  CurrencyToStringArgument arg;
  anon_union_24_3_e3d07ef4_for_data local_b8;
  anon_union_24_3_e3d07ef4_for_data local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined1 *puStack_60;
  QArrayData *local_58;
  char16_t *pcStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar12 = (this->d).d.ptr;
  if (pQVar12->m_data == &systemLocaleData) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pcStack_50 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::QVariant((QVariant *)&local_98,value);
    ::QVariant::QVariant((QVariant *)&local_78,(QVariant *)&local_98);
    local_58 = &((symbol->d).d)->super_QArrayData;
    pcStack_50 = (symbol->d).ptr;
    local_48 = (undefined1 *)(symbol->d).size;
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_58->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_58->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    ::QVariant::~QVariant((QVariant *)&local_98);
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar13 = systemLocale();
    ::QVariant::QVariant((QVariant *)&local_b8,(QMetaType)0x6ae780,&local_78);
    (*pQVar13->_vptr_QSystemLocale[2])(&local_98,pQVar13,0x20,&local_b8);
    ::QVariant::toString(__return_storage_ptr__,(QVariant *)&local_98);
    ::QVariant::~QVariant((QVariant *)&local_98);
    ::QVariant::~QVariant((QVariant *)&local_b8);
    lVar2 = (__return_storage_ptr__->d).size;
    if ((lVar2 == 0) && (pDVar6 = (__return_storage_ptr__->d).d, pDVar6 != (Data *)0x0)) {
      LOCK();
      (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((__return_storage_ptr__->d).d)->super_QArrayData,2,0x10);
      }
    }
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,0x10);
      }
    }
    ::QVariant::~QVariant((QVariant *)&local_78);
    if (lVar2 != 0) goto LAB_00313a72;
    pQVar12 = (this->d).d.ptr;
  }
  local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QLocaleData::unsLongLongToString
            ((QString *)&local_78,pQVar12->m_data,value,-1,10,-1,
             (~(pQVar12->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
               super_QFlagsStorage<QLocale::NumberOption>.i & 1) << 5);
  local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pcVar1 = (symbol->d).ptr;
  if (pcVar1 == (char16_t *)0x0) {
    currencySymbol((QString *)&local_98,this,CurrencySymbol);
  }
  else {
    local_98.shared = (PrivateShared *)(symbol->d).d;
    local_98._16_8_ = (symbol->d).size;
    local_98._8_8_ = pcVar1;
    if ((QArrayData *)local_98.shared != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((QArrayData *)local_98.shared)->ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((QArrayData *)local_98.shared)->ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  if ((undefined1 *)local_98._16_8_ == (undefined1 *)0x0) {
    currencySymbol((QString *)&local_b8,this,CurrencyIsoCode);
    uVar11 = local_98._8_8_;
    data = local_98.shared;
    uVar10 = local_b8._16_8_;
    uVar9 = local_b8.shared;
    pQVar4 = (QArrayData *)local_98.shared;
    pcVar1 = (char16_t *)local_98._8_8_;
    puVar7 = (undefined1 *)local_98._16_8_;
    pQVar8 = (QArrayData *)local_b8.shared;
    local_98._8_8_ = local_b8._8_8_;
    local_b8.shared = local_98.shared;
    local_98.shared = (PrivateShared *)uVar9;
    puVar5 = (undefined1 *)local_b8._16_8_;
    local_b8._8_8_ = uVar11;
    local_b8._16_8_ = local_98._16_8_;
    local_98._16_8_ = uVar10;
    if ((QArrayData *)data != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&((PrivateShared *)data)->ref)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&((PrivateShared *)data)->ref)->_q_value).super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&((PrivateShared *)data)->ref)->_q_value).super___atomic_base<int>.
          _M_i == 0) {
        QArrayData::deallocate((QArrayData *)data,2,0x10);
      }
    }
  }
  pQVar3 = ((this->d).d.ptr)->m_data;
  size = (ulong)pQVar3->m_currencyFormat_size;
  if (size == 0) {
    local_b8.shared = (PrivateShared *)0x0;
    local_b8._8_8_ = (char16_t *)0x0;
    local_b8._16_8_ = (undefined1 *)0x0;
  }
  else {
    QString::fromRawData
              ((QChar *)(
                        L"%1%2%1\xa0%2(%2%1)%2\xa0%1(%1\xa0%2)\x200f%1\xa0%2\x061c%1%2(\x061c%1%2)(%1%2)(%1)\xa0%2(%2\xa0%1)%2-%1%1\x202f%2\x200f%1\xa0\x200f%2\x200f\x200e-%1\xa0\x200f%2%2\xa0-%1%2−%1%2-\xa0%1\x200e%2\xa0%1\x200e(%2\xa0%1)"
                        + pQVar3->m_currencyFormat_idx),size);
  }
  QString::arg<QString&,QString&>
            (__return_storage_ptr__,(QString *)&local_b8,(QString *)&local_78,(QString *)&local_98);
  if ((QArrayData *)local_b8.shared != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_b8.shared)->ref)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&(local_b8.shared)->ref)->_q_value).super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_b8.shared)->ref)->_q_value).super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate((QArrayData *)local_b8.shared,2,0x10);
    }
  }
  if ((QArrayData *)local_98.shared != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_98.shared)->ref)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&(local_98.shared)->ref)->_q_value).super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_98.shared)->ref)->_q_value).super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate((QArrayData *)local_98.shared,2,0x10);
    }
  }
  if ((QArrayData *)local_78.shared != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_78.shared)->ref)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&(local_78.shared)->ref)->_q_value).super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_78.shared)->ref)->_q_value).super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate((QArrayData *)local_78.shared,2,0x10);
    }
  }
LAB_00313a72:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QLocale::toCurrencyString(qulonglong value, const QString &symbol) const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        QSystemLocale::CurrencyToStringArgument arg(value, symbol);
        auto res = systemLocale()->query(QSystemLocale::CurrencyToString,
                                         QVariant::fromValue(arg)).toString();
        if (!res.isEmpty())
            return res;
    }
#endif
    QString str = toString(value);
    QString sym = symbol.isNull() ? currencySymbol() : symbol;
    if (sym.isEmpty())
        sym = currencySymbol(CurrencyIsoCode);
    return d->m_data->currencyFormat().getData(currency_format_data).arg(str, sym);
}